

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O0

int file_to_archive(cpio *cpio,char *srcpath)

{
  long lVar1;
  mode_t mVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  void *pvVar6;
  char *__src;
  int local_44;
  int r;
  size_t len;
  archive_entry *spare;
  archive_entry *entry;
  char *destpath;
  char *srcpath_local;
  cpio *cpio_local;
  
  destpath = srcpath;
  srcpath_local = (char *)cpio;
  spare = archive_entry_new();
  if (spare == (archive_entry *)0x0) {
    lafe_errc(1,0,"Couldn\'t allocate entry");
  }
  archive_entry_copy_sourcepath(spare,destpath);
  local_44 = archive_read_disk_entry_from_file
                       (*(archive **)(srcpath_local + 0xd0),spare,-1,(stat_conflict *)0x0);
  if (-0x1a < local_44) {
    if (local_44 < 0) {
      pcVar3 = archive_error_string(*(archive **)(srcpath_local + 0xd0));
      lafe_warnc(0,"%s",pcVar3);
    }
    if (local_44 < -0x18) {
      archive_entry_free(spare);
      srcpath_local[0xe8] = '\x01';
      srcpath_local[0xe9] = '\0';
      srcpath_local[0xea] = '\0';
      srcpath_local[0xeb] = '\0';
      cpio_local._4_4_ = local_44;
    }
    else {
      if (-1 < *(int *)(srcpath_local + 0x90)) {
        archive_entry_set_uid(spare,(long)*(int *)(srcpath_local + 0x90));
      }
      if (*(long *)(srcpath_local + 0xa8) != 0) {
        archive_entry_set_uname(spare,*(char **)(srcpath_local + 0x98));
      }
      if (-1 < *(int *)(srcpath_local + 0xa0)) {
        archive_entry_set_gid(spare,(long)*(int *)(srcpath_local + 0xa0));
      }
      if (*(long *)(srcpath_local + 0xa8) != 0) {
        archive_entry_set_gname(spare,*(char **)(srcpath_local + 0xa8));
      }
      entry = (archive_entry *)destpath;
      if (*(long *)(srcpath_local + 0x70) != 0) {
        lVar1 = *(long *)(srcpath_local + 0x78);
        sVar4 = strlen(destpath);
        uVar5 = lVar1 + sVar4 + 8;
        if (*(ulong *)(srcpath_local + 0x80) <= uVar5) {
          while (*(ulong *)(srcpath_local + 0x80) <= uVar5) {
            *(long *)(srcpath_local + 0x80) = *(long *)(srcpath_local + 0x80) + 0x200;
            *(long *)(srcpath_local + 0x80) = *(long *)(srcpath_local + 0x80) << 1;
          }
          free(*(void **)(srcpath_local + 0x88));
          pvVar6 = malloc(*(size_t *)(srcpath_local + 0x80));
          *(void **)(srcpath_local + 0x88) = pvVar6;
          if (*(long *)(srcpath_local + 0x88) == 0) {
            lafe_errc(1,0xc,"Can\'t allocate path buffer");
          }
        }
        strcpy(*(char **)(srcpath_local + 0x88),*(char **)(srcpath_local + 0x70));
        pcVar3 = *(char **)(srcpath_local + 0x88);
        __src = remove_leading_slash(destpath);
        strcat(pcVar3,__src);
        entry = *(archive_entry **)(srcpath_local + 0x88);
      }
      if (*(int *)(srcpath_local + 0x68) != 0) {
        entry = (archive_entry *)cpio_rename((char *)entry);
      }
      if (entry == (archive_entry *)0x0) {
        archive_entry_free(spare);
        cpio_local._4_4_ = 0;
      }
      else {
        archive_entry_copy_pathname(spare,(char *)entry);
        len = 0;
        if ((*(long *)(srcpath_local + 0xf0) != 0) &&
           (mVar2 = archive_entry_filetype(spare), mVar2 != 0x4000)) {
          archive_entry_linkify
                    (*(archive_entry_linkresolver **)(srcpath_local + 0xf0),&spare,
                     (archive_entry **)&len);
        }
        if (spare != (archive_entry *)0x0) {
          local_44 = entry_to_archive((cpio *)srcpath_local,spare);
          archive_entry_free(spare);
          if (len != 0) {
            if (local_44 == 0) {
              local_44 = entry_to_archive((cpio *)srcpath_local,(archive_entry *)len);
            }
            archive_entry_free((archive_entry *)len);
          }
        }
        cpio_local._4_4_ = local_44;
      }
    }
    return cpio_local._4_4_;
  }
  pcVar3 = archive_error_string(*(archive **)(srcpath_local + 0xd0));
  lafe_errc(1,0,"%s",pcVar3);
}

Assistant:

static int
file_to_archive(struct cpio *cpio, const char *srcpath)
{
	const char *destpath;
	struct archive_entry *entry, *spare;
	size_t len;
	int r;

	/*
	 * Create an archive_entry describing the source file.
	 *
	 */
	entry = archive_entry_new();
	if (entry == NULL)
		lafe_errc(1, 0, "Couldn't allocate entry");
	archive_entry_copy_sourcepath(entry, srcpath);
	r = archive_read_disk_entry_from_file(cpio->archive_read_disk,
	    entry, -1, NULL);
	if (r < ARCHIVE_FAILED)
		lafe_errc(1, 0, "%s",
		    archive_error_string(cpio->archive_read_disk));
	if (r < ARCHIVE_OK)
		lafe_warnc(0, "%s",
		    archive_error_string(cpio->archive_read_disk));
	if (r <= ARCHIVE_FAILED) {
		archive_entry_free(entry);
		cpio->return_value = 1;
		return (r);
	}

	if (cpio->uid_override >= 0)
		archive_entry_set_uid(entry, cpio->uid_override);
	if (cpio->gname_override != NULL)
		archive_entry_set_uname(entry, cpio->uname_override);
	if (cpio->gid_override >= 0)
		archive_entry_set_gid(entry, cpio->gid_override);
	if (cpio->gname_override != NULL)
		archive_entry_set_gname(entry, cpio->gname_override);

	/*
	 * Generate a destination path for this entry.
	 * "destination path" is the name to which it will be copied in
	 * pass mode or the name that will go into the archive in
	 * output mode.
	 */
	destpath = srcpath;
	if (cpio->destdir) {
		len = cpio->destdir_len + strlen(srcpath) + 8;
		if (len >= cpio->pass_destpath_alloc) {
			while (len >= cpio->pass_destpath_alloc) {
				cpio->pass_destpath_alloc += 512;
				cpio->pass_destpath_alloc *= 2;
			}
			free(cpio->pass_destpath);
			cpio->pass_destpath = malloc(cpio->pass_destpath_alloc);
			if (cpio->pass_destpath == NULL)
				lafe_errc(1, ENOMEM,
				    "Can't allocate path buffer");
		}
		strcpy(cpio->pass_destpath, cpio->destdir);
		strcat(cpio->pass_destpath, remove_leading_slash(srcpath));
		destpath = cpio->pass_destpath;
	}
	if (cpio->option_rename)
		destpath = cpio_rename(destpath);
	if (destpath == NULL) {
		archive_entry_free(entry);
		return (0);
	}
	archive_entry_copy_pathname(entry, destpath);

	/*
	 * If we're trying to preserve hardlinks, match them here.
	 */
	spare = NULL;
	if (cpio->linkresolver != NULL
	    && archive_entry_filetype(entry) != AE_IFDIR) {
		archive_entry_linkify(cpio->linkresolver, &entry, &spare);
	}

	if (entry != NULL) {
		r = entry_to_archive(cpio, entry);
		archive_entry_free(entry);
		if (spare != NULL) {
			if (r == 0)
				r = entry_to_archive(cpio, spare);
			archive_entry_free(spare);
		}
	}
	return (r);
}